

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.h
# Opt level: O0

Analysis __thiscall spvtools::opt::CCPPass::GetPreservedAnalyses(CCPPass *this)

{
  Analysis AVar1;
  CCPPass *this_local;
  
  AVar1 = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  AVar1 = operator|(AVar1,kAnalysisDecorations);
  AVar1 = operator|(AVar1,kAnalysisCombinators);
  AVar1 = operator|(AVar1,kAnalysisCFG);
  AVar1 = operator|(AVar1,kAnalysisDominatorAnalysis);
  AVar1 = operator|(AVar1,kAnalysisNameMap);
  AVar1 = operator|(AVar1,kAnalysisConstants);
  AVar1 = operator|(AVar1,kAnalysisTypes);
  return AVar1;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisDecorations | IRContext::kAnalysisCombinators |
           IRContext::kAnalysisCFG | IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisNameMap | IRContext::kAnalysisConstants |
           IRContext::kAnalysisTypes;
  }